

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O2

void NJD_clear(NJD *njd)

{
  NJDNode *pNVar1;
  NJDNode *node;
  
  node = njd->head;
  while (node != (NJDNode *)0x0) {
    pNVar1 = node->next;
    NJDNode_clear(node);
    free(njd->head);
    njd->head = pNVar1;
    node = pNVar1;
  }
  njd->tail = (NJDNode *)0x0;
  return;
}

Assistant:

void NJD_clear(NJD * njd)
{
   NJDNode *node;

   while (njd->head != NULL) {
      node = njd->head->next;
      NJDNode_clear(njd->head);
      free(njd->head);
      njd->head = node;
   }
   njd->tail = NULL;
}